

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluRenderContext.cpp
# Opt level: O3

RenderContext *
glu::createDefaultRenderContext(Platform *platform,CommandLine *cmdLine,ApiType apiType)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  RenderContext *pRVar4;
  NotSupportedError *this;
  long *plVar5;
  long *plVar6;
  bool bVar7;
  uint uVar8;
  long lVar9;
  pointer __rhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  flagNames;
  allocator<char> local_10d;
  deUint32 local_10c;
  Platform *local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  RenderConfig local_68;
  
  local_68.width = -1;
  local_68.height = -1;
  local_68.surfaceType = SURFACETYPE_DONT_CARE;
  local_68.windowVisibility = VISIBILITY_VISIBLE;
  local_68.id = -1;
  local_68.redBits = -1;
  local_68.greenBits = -1;
  local_68.blueBits = -1;
  local_68.alphaBits = -1;
  local_68.depthBits = -1;
  local_68.stencilBits = -1;
  local_68.numSamples = -1;
  local_68.resetNotificationStrategy = RESET_NOTIFICATION_STRATEGY_NOT_SPECIFIED;
  pcVar3 = tcu::CommandLine::getGLContextFlags(cmdLine);
  if (pcVar3 == (char *)0x0) {
    uVar8 = 0;
  }
  else {
    pcVar3 = tcu::CommandLine::getGLContextFlags(cmdLine);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,pcVar3,&local_10d);
    de::splitString(&local_100,&local_a8,',');
    if (local_100.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_100.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar8 = 0;
    }
    else {
      uVar8 = 0;
      __rhs = local_100.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      local_10c = apiType.m_bits;
      local_108 = platform;
      do {
        lVar9 = 0;
        bVar7 = true;
        while( true ) {
          iVar2 = std::__cxx11::string::compare((char *)__rhs);
          if (iVar2 == 0) break;
          lVar9 = 1;
          bVar1 = !bVar7;
          bVar7 = false;
          if (bVar1) {
            tcu::print("ERROR: Unrecognized GL context flag \'%s\'\n",(__rhs->_M_dataplus)._M_p);
            tcu::print("Supported GL context flags:\n");
            tcu::print("  %s\n","debug");
            tcu::print("  %s\n","robust");
            this = (NotSupportedError *)__cxa_allocate_exception(0x38);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e8,"Unknown GL context flag \'","");
            std::operator+(&local_88,&local_e8,__rhs);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_88);
            local_c8 = (long *)*plVar5;
            plVar6 = plVar5 + 2;
            if (local_c8 == plVar6) {
              local_b8 = *plVar6;
              lStack_b0 = plVar5[3];
              local_c8 = &local_b8;
            }
            else {
              local_b8 = *plVar6;
            }
            local_c0 = plVar5[1];
            *plVar5 = (long)plVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            tcu::NotSupportedError::NotSupportedError
                      (this,(char *)local_c8,(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
                       ,0x7f);
            __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
          }
        }
        uVar8 = uVar8 | (&DAT_021894c8)[lVar9 * 4];
        __rhs = __rhs + 1;
      } while (__rhs != local_100.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
      uVar8 = uVar8 << 10;
      platform = local_108;
      apiType.m_bits = local_10c;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  local_68.type.super_ApiType.m_bits = (ApiType)(uVar8 | apiType.m_bits);
  parseRenderConfig(&local_68,cmdLine);
  pRVar4 = createRenderContext(platform,cmdLine,&local_68);
  return pRVar4;
}

Assistant:

RenderContext* createDefaultRenderContext (tcu::Platform& platform, const tcu::CommandLine& cmdLine, ApiType apiType)
{
	RenderConfig	config;
	ContextFlags	ctxFlags	= ContextFlags(0);

	if (cmdLine.getGLContextFlags())
		ctxFlags = parseContextFlags(cmdLine.getGLContextFlags());

	config.type = glu::ContextType(apiType, ctxFlags);
	parseRenderConfig(&config, cmdLine);

	return createRenderContext(platform, cmdLine, config);
}